

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

base64_urlencode * __thiscall
cppcms::filters::base64_urlencode::operator=(base64_urlencode *this,base64_urlencode *other)

{
  streamable *in_RSI;
  base64_urlencode *in_RDI;
  
  streamable::operator=(in_RSI,&in_RDI->obj_);
  return in_RDI;
}

Assistant:

base64_urlencode const &base64_urlencode::operator=(base64_urlencode const &other){ obj_ = other.obj_; return *this; }